

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Device.cpp
# Opt level: O2

Ptr<Device> __thiscall
myvk::Device::Create
          (Device *this,Ptr<PhysicalDevice> *physical_device,QueueSelectorFunc *queue_selector_func,
          PhysicalDeviceFeatures *features,
          vector<const_char_*,_std::allocator<const_char_*>_> *extensions)

{
  VkPhysicalDeviceVulkan12Features *__dest;
  VkPhysicalDeviceVulkan13Features *pVVar1;
  void *pvVar2;
  undefined4 uVar3;
  element_type *peVar4;
  VkBool32 VVar5;
  VkBool32 VVar6;
  VkBool32 VVar7;
  VkBool32 VVar8;
  VkBool32 VVar9;
  VkBool32 VVar10;
  VkBool32 VVar11;
  VkBool32 VVar12;
  VkBool32 VVar13;
  VkBool32 VVar14;
  VkBool32 VVar15;
  VkBool32 VVar16;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var17;
  VkResult VVar18;
  long lVar19;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  VkPhysicalDeviceVulkan13Features *pVVar20;
  VkPhysicalDeviceVulkan13Features *pVVar21;
  byte bVar22;
  Ptr<Device> PVar23;
  shared_ptr<myvk::Device> ret;
  vector<myvk::QueueSelection,_std::allocator<myvk::QueueSelection>_> queue_selections;
  vector<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_> queue_create_infos;
  vector<float,_std::allocator<float>_> queue_priorities;
  QueueSelectionResolver queue_resolver;
  
  bVar22 = 0;
  std::make_shared<myvk::Device>();
  std::__shared_ptr<myvk::PhysicalDevice,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&((ret.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              m_physical_device_ptr).
              super___shared_ptr<myvk::PhysicalDevice,_(__gnu_cxx::_Lock_policy)2>,
             &physical_device->super___shared_ptr<myvk::PhysicalDevice,_(__gnu_cxx::_Lock_policy)2>)
  ;
  std::__shared_ptr<myvk::PhysicalDevice_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<myvk::PhysicalDevice,void>
            ((__shared_ptr<myvk::PhysicalDevice_const,(__gnu_cxx::_Lock_policy)2> *)&queue_resolver,
             &physical_device->super___shared_ptr<myvk::PhysicalDevice,_(__gnu_cxx::_Lock_policy)2>)
  ;
  std::
  function<std::vector<myvk::QueueSelection,_std::allocator<myvk::QueueSelection>_>_(const_std::shared_ptr<const_myvk::PhysicalDevice>_&)>
  ::operator()(&queue_selections,queue_selector_func,
               (shared_ptr<const_myvk::PhysicalDevice> *)&queue_resolver);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &queue_resolver.m_queue_selections.
              super__Vector_base<myvk::QueueSelection,_std::allocator<myvk::QueueSelection>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  if (queue_selections.
      super__Vector_base<myvk::QueueSelection,_std::allocator<myvk::QueueSelection>_>._M_impl.
      super__Vector_impl_data._M_start ==
      queue_selections.
      super__Vector_base<myvk::QueueSelection,_std::allocator<myvk::QueueSelection>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    (this->super_Base)._vptr_Base = (_func_int **)0x0;
    (this->super_Base).super_enable_shared_from_this<myvk::Base>._M_weak_this.
    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    goto LAB_0019658e;
  }
  QueueSelectionResolver::QueueSelectionResolver(&queue_resolver,physical_device,&queue_selections);
  queue_create_infos.
  super__Vector_base<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  queue_create_infos.
  super__Vector_base<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  queue_create_infos.
  super__Vector_base<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  queue_priorities.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  queue_priorities.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  queue_priorities.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  QueueSelectionResolver::EnumerateDeviceQueueCreateInfos
            (&queue_resolver,&queue_create_infos,&queue_priorities);
  VVar18 = create_device(ret.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         &queue_create_infos,extensions,features);
  if (VVar18 == VK_SUCCESS) {
    volkLoadDevice((ret.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   m_device);
    VVar18 = create_allocator(ret.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
    if (VVar18 != VK_SUCCESS) goto LAB_00196562;
    VVar18 = create_pipeline_cache
                       (ret.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    peVar4 = ret.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (VVar18 != VK_SUCCESS) goto LAB_00196562;
    memcpy(&(ret.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_features,
           features,0xdc);
    uVar3 = *(undefined4 *)&(features->vk11).field_0x4;
    pvVar2 = (features->vk11).pNext;
    VVar5 = (features->vk11).storageBuffer16BitAccess;
    VVar6 = (features->vk11).uniformAndStorageBuffer16BitAccess;
    VVar7 = (features->vk11).storagePushConstant16;
    VVar8 = (features->vk11).storageInputOutput16;
    VVar9 = (features->vk11).multiview;
    VVar10 = (features->vk11).multiviewGeometryShader;
    VVar11 = (features->vk11).multiviewTessellationShader;
    VVar12 = (features->vk11).variablePointersStorageBuffer;
    VVar13 = (features->vk11).variablePointers;
    VVar14 = (features->vk11).protectedMemory;
    VVar15 = (features->vk11).samplerYcbcrConversion;
    VVar16 = (features->vk11).shaderDrawParameters;
    (peVar4->m_features).vk11.sType = (features->vk11).sType;
    *(undefined4 *)&(peVar4->m_features).vk11.field_0x4 = uVar3;
    (peVar4->m_features).vk11.pNext = pvVar2;
    (peVar4->m_features).vk11.storageBuffer16BitAccess = VVar5;
    (peVar4->m_features).vk11.uniformAndStorageBuffer16BitAccess = VVar6;
    (peVar4->m_features).vk11.storagePushConstant16 = VVar7;
    (peVar4->m_features).vk11.storageInputOutput16 = VVar8;
    (peVar4->m_features).vk11.multiview = VVar9;
    (peVar4->m_features).vk11.multiviewGeometryShader = VVar10;
    (peVar4->m_features).vk11.multiviewTessellationShader = VVar11;
    (peVar4->m_features).vk11.variablePointersStorageBuffer = VVar12;
    (peVar4->m_features).vk11.variablePointers = VVar13;
    (peVar4->m_features).vk11.protectedMemory = VVar14;
    (peVar4->m_features).vk11.samplerYcbcrConversion = VVar15;
    (peVar4->m_features).vk11.shaderDrawParameters = VVar16;
    __dest = &(peVar4->m_features).vk12;
    memcpy(__dest,&features->vk12,0xd0);
    pVVar1 = &(peVar4->m_features).vk13;
    pVVar20 = &features->vk13;
    pVVar21 = pVVar1;
    for (lVar19 = 10; lVar19 != 0; lVar19 = lVar19 + -1) {
      uVar3 = *(undefined4 *)&pVVar20->field_0x4;
      pVVar21->sType = pVVar20->sType;
      *(undefined4 *)&pVVar21->field_0x4 = uVar3;
      pVVar20 = (VkPhysicalDeviceVulkan13Features *)((long)pVVar20 + (ulong)bVar22 * -0x10 + 8);
      pVVar21 = (VkPhysicalDeviceVulkan13Features *)((long)pVVar21 + (ulong)bVar22 * -0x10 + 8);
    }
    (peVar4->m_features).vk11.pNext = __dest;
    (peVar4->m_features).vk12.pNext = pVVar1;
    (peVar4->m_features).vk13.pNext = (void *)0x0;
    QueueSelectionResolver::FetchDeviceQueues(&queue_resolver,&ret);
    _Var17 = ret.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ret.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_Base)._vptr_Base =
         (_func_int **)ret.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->super_Base).super_enable_shared_from_this<myvk::Base>._M_weak_this.
    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)_Var17._M_pi;
    ret.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  }
  else {
LAB_00196562:
    (this->super_Base)._vptr_Base = (_func_int **)0x0;
    (this->super_Base).super_enable_shared_from_this<myvk::Base>._M_weak_this.
    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&queue_priorities.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>::
  ~_Vector_base(&queue_create_infos.
                 super__Vector_base<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>
               );
  QueueSelectionResolver::~QueueSelectionResolver(&queue_resolver);
LAB_0019658e:
  std::vector<myvk::QueueSelection,_std::allocator<myvk::QueueSelection>_>::~vector
            (&queue_selections);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ret.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  PVar23.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar23.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr<Device>)PVar23.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<Device> Device::Create(const Ptr<PhysicalDevice> &physical_device, const QueueSelectorFunc& queue_selector_func,
                           const PhysicalDeviceFeatures &features, const std::vector<const char *> &extensions) {
	auto ret = std::make_shared<Device>();
	ret->m_physical_device_ptr = physical_device;

	std::vector<QueueSelection> queue_selections = queue_selector_func(physical_device);
	if (queue_selections.empty())
		return nullptr;
	QueueSelectionResolver queue_resolver{physical_device, std::move(queue_selections)};
	std::vector<VkDeviceQueueCreateInfo> queue_create_infos;
	std::vector<float> queue_priorities;
	queue_resolver.EnumerateDeviceQueueCreateInfos(&queue_create_infos, &queue_priorities);

	if (ret->create_device(queue_create_infos, extensions, features) != VK_SUCCESS)
		return nullptr;
	volkLoadDevice(ret->m_device);
	if (ret->create_allocator() != VK_SUCCESS)
		return nullptr;
	if (ret->create_pipeline_cache() != VK_SUCCESS)
		return nullptr;
	ret->m_features = features;
	queue_resolver.FetchDeviceQueues(ret);
	return ret;
}